

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
::_positive_negative_vine_swap
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
           *this,Index columnIndex)

{
  ID_index rowIndex;
  
  rowIndex = _get_row_id_from_position(this,columnIndex + 1);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  ::zero_entry((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                *)(this + 2),columnIndex,rowIndex);
  _swap_at_index(this,columnIndex);
  _positive_negative_transpose(this,columnIndex);
  return true;
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::_positive_negative_vine_swap(Index columnIndex) 
{
  _matrix()->mirrorMatrixU_.zero_entry(columnIndex, _get_row_id_from_position(columnIndex + 1));

  _swap_at_index(columnIndex);
  _positive_negative_transpose(columnIndex);

  return true;
}